

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int proto_eq(MIR_item_t pi1,MIR_item_t pi2,void *arg)

{
  MIR_type_t *pMVar1;
  MIR_type_t *pMVar2;
  int iVar3;
  MIR_proto_t pMVar4;
  MIR_proto_t pMVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  MIR_var_t *pMVar9;
  MIR_var_t *pMVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  
  pMVar4 = (pi1->u).proto;
  pMVar5 = (pi2->u).proto;
  if ((pMVar4->nres == pMVar5->nres) && (pMVar4->vararg_p == pMVar5->vararg_p)) {
    sVar7 = VARR_MIR_var_tlength(pMVar4->args);
    sVar8 = VARR_MIR_var_tlength(pMVar5->args);
    if (sVar7 == sVar8) {
      uVar12 = 0;
      do {
        if (pMVar4->nres == uVar12) {
          pMVar9 = VARR_MIR_var_taddr(pMVar4->args);
          pMVar10 = VARR_MIR_var_taddr(pMVar5->args);
          uVar12 = 0;
          for (lVar11 = 0x10;
              (((sVar7 = VARR_MIR_var_tlength(pMVar4->args), uVar12 < sVar7 &&
                (iVar3 = *(int *)((long)pMVar9 + lVar11 + -0x10),
                iVar3 == *(int *)((long)pMVar10 + lVar11 + -0x10))) &&
               (iVar6 = strcmp(*(char **)((long)pMVar9 + lVar11 + -8),
                               *(char **)((long)pMVar10 + lVar11 + -8)), iVar6 == 0)) &&
              ((iVar3 - 0x12U < 0xfffffffa ||
               (*(long *)((long)&pMVar9->type + lVar11) == *(long *)((long)&pMVar10->type + lVar11))
               ))); lVar11 = lVar11 + 0x18) {
            uVar12 = uVar12 + 1;
          }
          return (uint)(sVar7 <= uVar12);
        }
        pMVar1 = pMVar4->res_types + uVar12;
        pMVar2 = pMVar5->res_types + uVar12;
        uVar12 = uVar12 + 1;
      } while (*pMVar1 == *pMVar2);
    }
  }
  return 0;
}

Assistant:

static int proto_eq (MIR_item_t pi1, MIR_item_t pi2, void *arg MIR_UNUSED) {
  MIR_proto_t p1 = pi1->u.proto, p2 = pi2->u.proto;

  if (p1->nres != p2->nres || p1->vararg_p != p2->vararg_p
      || VARR_LENGTH (MIR_var_t, p1->args) != VARR_LENGTH (MIR_var_t, p2->args))
    return FALSE;
  for (uint32_t i = 0; i < p1->nres; i++)
    if (p1->res_types[i] != p2->res_types[i]) return FALSE;

  MIR_var_t *args1 = VARR_ADDR (MIR_var_t, p1->args), *args2 = VARR_ADDR (MIR_var_t, p2->args);

  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p1->args); i++)
    if (args1[i].type != args2[i].type || strcmp (args1[i].name, args2[i].name) != 0
        || (MIR_all_blk_type_p (args1[i].type) && args1[i].size != args2[i].size))
      return FALSE;
  return TRUE;
}